

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

ParseResult * toml::parse(ParseResult *__return_storage_ptr__,istream *is)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Value *v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *er;
  Parser parser;
  undefined1 local_130 [8];
  anon_union_8_8_51f126cb_for_Value_2 local_128;
  Value local_120;
  undefined1 local_110 [16];
  Value local_100;
  string local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  Parser local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
    internal::Parser::Parser(&local_b0,is);
    internal::Parser::parse((Parser *)local_130);
    if (local_130._0_4_ == NULL_TYPE) {
      local_100.type_ = 0;
      local_100.field_1 = local_128;
      local_128.null_ = (void *)0x0;
      paVar1 = &local_c0;
      local_d0._M_allocated_capacity = (size_type)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_b0.errorReason_._M_dataplus._M_p,
                 local_b0.errorReason_._M_dataplus._M_p + local_b0.errorReason_._M_string_length);
      v = &local_100;
      er = &local_d0;
    }
    else {
      local_120.type_ = local_130._0_4_;
      switch(local_130._0_4_) {
      case 1:
        local_120.field_1.bool_ = local_128.bool_;
        break;
      case 2:
      case 4:
      case 5:
      case 6:
      case 7:
        local_120.field_1 = local_128;
        break;
      case 3:
        local_120.field_1 = local_128;
        break;
      default:
        local_120.type_ = NULL_TYPE;
        local_120.field_1.null_ = (pointer)0x0;
      }
      local_130._0_4_ = NULL_TYPE;
      local_128.null_ = (void *)0x0;
      paVar1 = &local_30;
      local_40._8_8_ = 0;
      local_30._M_local_buf[0] = '\0';
      v = &local_120;
      er = &local_40;
      local_40._M_allocated_capacity = (size_type)paVar1;
    }
    ParseResult::ParseResult(__return_storage_ptr__,v,(string *)er);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)er->_M_allocated_capacity != paVar1) {
      operator_delete((long *)er->_M_allocated_capacity,paVar1->_M_allocated_capacity + 1);
    }
    Value::~Value(v);
    Value::~Value((Value *)local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.errorReason_._M_dataplus._M_p != &local_b0.errorReason_.field_2) {
      operator_delete(local_b0.errorReason_._M_dataplus._M_p,
                      local_b0.errorReason_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.token_.str_value_._M_dataplus._M_p != &local_b0.token_.str_value_.field_2) {
      operator_delete(local_b0.token_.str_value_._M_dataplus._M_p,
                      local_b0.token_.str_value_.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_110._0_4_ = NULL_TYPE;
    local_110._8_8_ = (void *)0x0;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"stream is in bad state. file does not exist?","");
    ParseResult::ParseResult(__return_storage_ptr__,(Value *)local_110,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    Value::~Value((Value *)local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ParseResult parse(std::istream& is)
{
    if (!is) {
        return ParseResult(toml::Value(), "stream is in bad state. file does not exist?");
    }

    internal::Parser parser(is);
    toml::Value v = parser.parse();

    if (v.valid())
        return ParseResult(std::move(v), std::string());

    return ParseResult(std::move(v), std::move(parser.errorReason()));
}